

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_inplace_union(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  ulong newarraysize;
  _Bool _Var2;
  ulong uVar3;
  size_t k;
  ulong uVar4;
  _Bool _Var5;
  
  uVar1 = b1->arraysize;
  newarraysize = b2->arraysize;
  uVar3 = newarraysize;
  if (uVar1 < newarraysize) {
    uVar3 = uVar1;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    b1->array[uVar4] = b1->array[uVar4] | b2->array[uVar4];
  }
  _Var5 = true;
  if (uVar1 <= newarraysize && newarraysize - uVar1 != 0) {
    _Var5 = false;
    _Var2 = bitset_resize(b1,newarraysize,false);
    if (_Var2) {
      memcpy(b1->array + uVar1,b2->array + uVar1,(newarraysize - uVar1) * 8);
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

bool bitset_inplace_union(bitset_t *CROARING_CBITSET_RESTRICT b1,
                          const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        b1->array[k] |= b2->array[k];
    }
    if (b2->arraysize > b1->arraysize) {
        size_t oldsize = b1->arraysize;
        if (!bitset_resize(b1, b2->arraysize, false)) return false;
        memcpy(b1->array + oldsize, b2->array + oldsize,
               (b2->arraysize - oldsize) * sizeof(uint64_t));
    }
    return true;
}